

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::validateNormalBlockElements(FunctionValidator *this,Block *curr)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  ostream *poVar4;
  Type local_50;
  Type local_48;
  uintptr_t local_40;
  uintptr_t local_38;
  Type local_30;
  Type backType;
  uint local_1c;
  Index i;
  Block *curr_local;
  FunctionValidator *this_local;
  
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (1 < sVar2) {
    for (local_1c = 0;
        sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          (&(curr->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ), (ulong)local_1c < sVar2 - 1; local_1c = local_1c + 1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(curr->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)local_1c);
      bVar1 = wasm::Type::isConcrete(&(*ppEVar3)->type);
      bVar1 = shouldBeTrue<wasm::Block*>
                        (this,(bool)((bVar1 ^ 0xffU) & 1),curr,
                         "non-final block elements returning a value must be drop()ed (binaryen\'s autodrop option might help you)"
                        );
      if ((!bVar1) && ((this->info->quiet & 1U) == 0)) {
        poVar4 = getStream(this);
        poVar4 = std::operator<<(poVar4,"(on index ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
        poVar4 = std::operator<<(poVar4,":\n");
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)local_1c);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*ppEVar3);
        poVar4 = std::operator<<(poVar4,"\n), type: ");
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)local_1c);
        backType.id = ((*ppEVar3)->type).id;
        poVar4 = wasm::operator<<(poVar4,backType);
        std::operator<<(poVar4,"\n");
      }
    }
  }
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (sVar2 != 0) {
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(curr->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    local_30.id = ((*ppEVar3)->type).id;
    bVar1 = wasm::Type::isConcrete
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                        type);
    if (bVar1) {
      bVar1 = wasm::Type::isConcrete(&local_30);
      if (bVar1) {
        local_38 = local_30.id;
        local_40 = (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                   id;
        shouldBeSubType(this,local_30,(Type)local_40,(Expression *)curr,
                        "block with value and last element with value must match types");
      }
      else {
        local_48.id = local_30.id;
        wasm::Type::Type(&local_50,none);
        shouldBeUnequal<wasm::Block*,wasm::Type>
                  (this,local_48,local_50,curr,
                   "block with value must not have last element that is none");
      }
    }
    else {
      bVar1 = wasm::Type::isConcrete(&local_30);
      shouldBeFalse<wasm::Block*>
                (this,bVar1,curr,
                 "if block is not returning a value, final element should not flow out a value");
    }
  }
  bVar1 = wasm::Type::isConcrete
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                      type);
  if (bVar1) {
    sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(curr->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    shouldBeTrue<wasm::Block*>(this,sVar2 != 0,curr,"block with a value must not be empty");
  }
  return;
}

Assistant:

void FunctionValidator::validateNormalBlockElements(Block* curr) {
  if (curr->list.size() > 1) {
    for (Index i = 0; i < curr->list.size() - 1; i++) {
      if (!shouldBeTrue(
            !curr->list[i]->type.isConcrete(),
            curr,
            "non-final block elements returning a value must be drop()ed "
            "(binaryen's autodrop option might help you)") &&
          !info.quiet) {
        getStream() << "(on index " << i << ":\n"
                    << curr->list[i] << "\n), type: " << curr->list[i]->type
                    << "\n";
      }
    }
  }
  if (curr->list.size() > 0) {
    auto backType = curr->list.back()->type;
    if (!curr->type.isConcrete()) {
      shouldBeFalse(backType.isConcrete(),
                    curr,
                    "if block is not returning a value, final element should "
                    "not flow out a value");
    } else {
      if (backType.isConcrete()) {
        shouldBeSubType(
          backType,
          curr->type,
          curr,
          "block with value and last element with value must match types");
      } else {
        shouldBeUnequal(
          backType,
          Type(Type::none),
          curr,
          "block with value must not have last element that is none");
      }
    }
  }
  if (curr->type.isConcrete()) {
    shouldBeTrue(
      curr->list.size() > 0, curr, "block with a value must not be empty");
  }
}